

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,void **vtt)

{
  u32 uVar1;
  ITexture **ppIVar2;
  COpenGLExtensionHandler *in_RSI;
  long *in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  uint local_14;
  
  *in_RDI = *(long *)in_RSI;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = *(undefined8 *)in_RSI->DimAliasedLine
  ;
  if (((int)in_RDI[0x11] != 0) && (*(int *)((long)in_RDI + 0x7c) != 0)) {
    COpenGLExtensionHandler::irrGlDeleteFramebuffers
              (in_RSI,(GLsizei)((ulong)in_RDI >> 0x20),
               (GLuint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  local_14 = 0;
  while( true ) {
    uVar3 = local_14;
    uVar1 = core::array<irr::video::ITexture_*>::size((array<irr::video::ITexture_*> *)0x34d7fa);
    if (uVar1 <= uVar3) break;
    ppIVar2 = core::array<irr::video::ITexture_*>::operator[]
                        ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    if (*ppIVar2 != (ITexture *)0x0) {
      core::array<irr::video::ITexture_*>::operator[]
                ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
      ;
    }
    local_14 = local_14 + 1;
  }
  if (in_RDI[5] != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  core::array<unsigned_int>::~array((array<unsigned_int> *)0x34d87b);
  IRenderTarget::~IRenderTarget
            ((IRenderTarget *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
             (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}